

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::~CharScanner(CharScanner *this)

{
  TokenStream *in_RDI;
  RefCount<antlr::LexerInputState> *unaff_retaddr;
  
  in_RDI->_vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_0037a910;
  RefCount<antlr::LexerInputState>::~RefCount(unaff_retaddr);
  TokenRefCount<antlr::Token>::~TokenRefCount((TokenRefCount<antlr::Token> *)unaff_retaddr);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x138486);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  TokenStream::~TokenStream(in_RDI);
  return;
}

Assistant:

virtual ~CharScanner()
	{
	}